

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_14(QPDF *pdf,char *arg2)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  int iVar2;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__x;
  long lVar3;
  QPDFObjGen QVar4;
  element_type *peVar5;
  ostream *poVar6;
  Buffer *this_00;
  FILE *__s;
  void *__ptr;
  size_t __size;
  logic_error *this_01;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  QPDFObjectHandle QVar10;
  QPDFObjectHandle QVar11;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  dict_items;
  QPDFObjectHandle qdict;
  value_type orig_page3;
  value_type orig_page2;
  QPDFObjectHandle new_dict;
  QPDFObjectHandle qarray;
  QPDFObjectHandle trailer;
  string filename;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> array_elements;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> pages;
  QPDFWriter w;
  undefined1 local_188 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_180;
  _Base_ptr local_178 [3];
  size_t local_160;
  long *local_158;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  long local_148 [2];
  QPDFObjGen local_138;
  element_type *local_130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_128;
  element_type *local_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_118;
  element_type *local_110;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  undefined8 local_100;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  string local_f0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  undefined8 local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  undefined8 local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  long *local_b0 [2];
  long local_a0 [2];
  key_type local_90;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_70;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_58;
  QPDFWriter local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_138 = (QPDFObjGen)pdf;
  __x = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&local_58,__x);
  if ((long)local_58.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_58.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
            .super__Vector_impl_data._M_start != 0x40) {
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_01,"test 14 not called 4-page file");
    __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_110 = local_58.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
              _M_impl.super__Vector_impl_data._M_start[1].super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_108 = local_58.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
              _M_impl.super__Vector_impl_data._M_start[1].super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_108->_M_use_count = local_108->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_108->_M_use_count = local_108->_M_use_count + 1;
    }
  }
  if ((ulong)((long)local_58.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_58.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) < 3) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",2);
LAB_00118219:
    __assert_fail("orig_page2.getKey(\"/OrigPage\").getIntValue() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,600,"void test_14(QPDF &, const char *)");
  }
  local_120 = local_58.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
              _M_impl.super__Vector_impl_data._M_start[2].super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_118 = local_58.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
              _M_impl.super__Vector_impl_data._M_start[2].super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_118 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_118->_M_use_count = local_118->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_118->_M_use_count = local_118->_M_use_count + 1;
    }
  }
  local_188 = (undefined1  [8])local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"/OrigPage","");
  QPDFObjectHandle::getKey((string *)&local_158);
  lVar3 = QPDFObjectHandle::getIntValue();
  if (lVar3 != 2) goto LAB_00118219;
  if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
  }
  if (local_188 != (undefined1  [8])local_178) {
    operator_delete((void *)local_188,(ulong)((long)&local_178[0]->_M_color + 1));
  }
  local_188 = (undefined1  [8])local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"/OrigPage","");
  QPDFObjectHandle::getKey((string *)&local_158);
  lVar3 = QPDFObjectHandle::getIntValue();
  if (lVar3 != 3) {
    __assert_fail("orig_page3.getKey(\"/OrigPage\").getIntValue() == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x259,"void test_14(QPDF &, const char *)");
  }
  if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
  }
  if (local_188 != (undefined1  [8])local_178) {
    operator_delete((void *)local_188,(ulong)((long)&local_178[0]->_M_color + 1));
  }
  QVar4 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  QPDFObjectHandle::getObjGen();
  QPDF::swapObjects(local_138,QVar4);
  local_188 = (undefined1  [8])local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"/OrigPage","");
  QPDFObjectHandle::getKey((string *)&local_158);
  lVar3 = QPDFObjectHandle::getIntValue();
  if (lVar3 != 3) {
    __assert_fail("orig_page2.getKey(\"/OrigPage\").getIntValue() == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x25b,"void test_14(QPDF &, const char *)");
  }
  if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
  }
  if (local_188 != (undefined1  [8])local_178) {
    operator_delete((void *)local_188,(ulong)((long)&local_178[0]->_M_color + 1));
  }
  local_188 = (undefined1  [8])local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"/OrigPage","");
  QPDFObjectHandle::getKey((string *)&local_158);
  lVar3 = QPDFObjectHandle::getIntValue();
  if (lVar3 != 2) {
    __assert_fail("orig_page3.getKey(\"/OrigPage\").getIntValue() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x25c,"void test_14(QPDF &, const char *)");
  }
  if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
  }
  if (local_188 != (undefined1  [8])local_178) {
    operator_delete((void *)local_188,(ulong)((long)&local_178[0]->_M_color + 1));
  }
  QPDF::getTrailer();
  local_188 = (undefined1  [8])local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"/QDict","");
  QPDFObjectHandle::getKey((string *)&local_130);
  if (local_188 != (undefined1  [8])local_178) {
    operator_delete((void *)local_188,(ulong)((long)&local_178[0]->_M_color + 1));
  }
  local_188 = (undefined1  [8])local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"/QArray","");
  QPDFObjectHandle::getKey(local_f0);
  if (local_188 != (undefined1  [8])local_178) {
    operator_delete((void *)local_188,(ulong)((long)&local_178[0]->_M_color + 1));
  }
  QPDFObjectHandle::isDictionary();
  QPDFObjectHandle::newDictionary();
  local_188 = (undefined1  [8])local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"/NewDict","");
  QPDFObjectHandle::newInteger((longlong)&local_158);
  QPDFObjectHandle::replaceKey((string *)&local_100,(QPDFObjectHandle *)local_188);
  if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
  }
  if (local_188 != (undefined1  [8])local_178) {
    operator_delete((void *)local_188,(ulong)((long)&local_178[0]->_M_color + 1));
  }
  peVar5 = (element_type *)QPDFObjectHandle::getObjGen();
  local_d0 = local_130;
  local_c8 = p_Stack_128;
  if (p_Stack_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Stack_128->_M_use_count = p_Stack_128->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Stack_128->_M_use_count = p_Stack_128->_M_use_count + 1;
    }
  }
  QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_d0;
  QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar5;
  QPDF::replaceObject(local_138,QVar10);
  if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
  }
  peVar5 = (element_type *)QPDFObjectHandle::getObjGen();
  local_e0 = local_100;
  local_d8 = local_f8;
  if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_f8->_M_use_count = local_f8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_f8->_M_use_count = local_f8->_M_use_count + 1;
    }
  }
  QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_e0;
  QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar5;
  QPDF::replaceObject(local_138,QVar11);
  if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"old dict: ",10);
  local_188 = (undefined1  [8])local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"/NewDict","");
  QPDFObjectHandle::getKey((string *)&local_158);
  QPDFObjectHandle::getIntValue();
  poVar6 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
  }
  if (local_188 != (undefined1  [8])local_178) {
    operator_delete((void *)local_188,(ulong)((long)&local_178[0]->_M_color + 1));
  }
  QVar4 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  QPDFObjectHandle::getObjGen();
  QPDF::swapObjects(local_138,QVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"swapped array: ",0xf);
  QPDFObjectHandle::getArrayItem((int)&local_158);
  QPDFObjectHandle::getName_abi_cxx11_();
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_188,(long)_Stack_180._M_pi);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (local_188 != (undefined1  [8])local_178) {
    operator_delete((void *)local_188,(ulong)((long)&local_178[0]->_M_color + 1));
  }
  if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"new dict: ",10);
  local_188 = (undefined1  [8])local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"/NewDict","");
  QPDFObjectHandle::getKey((string *)&local_158);
  QPDFObjectHandle::getIntValue();
  poVar6 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
  }
  if (local_188 != (undefined1  [8])local_178) {
    operator_delete((void *)local_188,(ulong)((long)&local_178[0]->_M_color + 1));
  }
  QPDFObjectHandle::getObjGen();
  QPDF::getObjectByObjGen((QPDFObjGen)local_188);
  this = p_Stack_128;
  p_Stack_128 = _Stack_180._M_pi;
  local_130 = (element_type *)local_188;
  local_188 = (undefined1  [8])0x0;
  _Stack_180._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  if (_Stack_180._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_180._M_pi);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"swapped array: ",0xf);
  QPDFObjectHandle::getArrayItem((int)&local_158);
  QPDFObjectHandle::getName_abi_cxx11_();
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_188,(long)_Stack_180._M_pi);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (local_188 != (undefined1  [8])local_178) {
    operator_delete((void *)local_188,(ulong)((long)&local_178[0]->_M_color + 1));
  }
  if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
  }
  QPDFObjectHandle::getArrayAsVector();
  QPDFObjectHandle::getDictAsMap_abi_cxx11_();
  if ((long)local_70.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_70.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
            .super__Vector_impl_data._M_start == 0x10) {
    QPDFObjectHandle::getName_abi_cxx11_();
    iVar2 = std::__cxx11::string::compare((char *)&local_158);
    bVar1 = false;
    if (iVar2 == 0) {
      bVar9 = false;
      if (local_160 == 1) {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"/NewDict","");
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                      *)local_188,&local_90);
        lVar3 = QPDFObjectHandle::getIntValue();
        bVar9 = lVar3 == 2;
        bVar1 = true;
      }
      goto LAB_00117f7d;
    }
  }
  bVar1 = false;
  bVar9 = false;
LAB_00117f7d:
  if ((bVar1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2)) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (((long)local_70.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_70.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
             _M_impl.super__Vector_impl_data._M_start == 0x10) && (local_158 != local_148)) {
    operator_delete(local_158,local_148[0] + 1);
  }
  if (bVar9) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"array and dictionary contents are correct",0x29);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
  }
  iVar2 = 1;
  do {
    QPDFWriter::QPDFWriter(local_40,(QPDF *)local_138);
    QPDFWriter::setOutputMemory();
    QPDFWriter::setStaticID(SUB81(local_40,0));
    QPDFWriter::setStreamDataMode((qpdf_stream_data_e)local_40);
    QPDFWriter::write();
    this_00 = (Buffer *)QPDFWriter::getBuffer();
    pcVar8 = "b.pdf";
    if (iVar2 == 1) {
      pcVar8 = "a.pdf";
    }
    pcVar7 = "";
    if (iVar2 == 1) {
      pcVar7 = "";
    }
    local_b0[0] = local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,pcVar8,pcVar7);
    __s = (FILE *)QUtil::safe_fopen((char *)local_b0[0],"wb");
    __ptr = (void *)Buffer::getBuffer();
    __size = Buffer::getSize();
    fwrite(__ptr,__size,1,__s);
    fclose(__s);
    Buffer::~Buffer(this_00);
    operator_delete(this_00,8);
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0],local_a0[0] + 1);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    iVar2 = iVar2 + -1;
  } while (iVar2 == 0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
               *)local_188);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_70);
  if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
  }
  if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
  }
  if (p_Stack_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_128);
  }
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  if (local_118 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118);
  }
  if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_58);
  return;
}

Assistant:

static void
test_14(QPDF& pdf, char const* arg2)
{
    // Exercise swap and replace.  This test case is designed for
    // a specific file.
    std::vector<QPDFObjectHandle> pages = pdf.getAllPages();
    if (pages.size() != 4) {
        throw std::logic_error("test 14 not called 4-page file");
    }
    // Swap pages 2 and 3
    auto orig_page2 = pages.at(1);
    auto orig_page3 = pages.at(2);
    assert(orig_page2.getKey("/OrigPage").getIntValue() == 2);
    assert(orig_page3.getKey("/OrigPage").getIntValue() == 3);
    pdf.swapObjects(orig_page2.getObjGen(), orig_page3.getObjGen());
    assert(orig_page2.getKey("/OrigPage").getIntValue() == 3);
    assert(orig_page3.getKey("/OrigPage").getIntValue() == 2);
    // Replace object and swap objects
    QPDFObjectHandle trailer = pdf.getTrailer();
    QPDFObjectHandle qdict = trailer.getKey("/QDict");
    QPDFObjectHandle qarray = trailer.getKey("/QArray");
    // Force qdict but not qarray to resolve
    qdict.isDictionary();
    QPDFObjectHandle new_dict = QPDFObjectHandle::newDictionary();
    new_dict.replaceKey("/NewDict", QPDFObjectHandle::newInteger(2));
    try {
        // Do it wrong first...
        pdf.replaceObject(qdict.getObjGen(), qdict);
    } catch (std::logic_error const&) {
        std::cout << "caught logic error as expected" << std::endl;
    }
    pdf.replaceObject(qdict.getObjGen(), new_dict);
    // Now qdict points to the new dictionary
    std::cout << "old dict: " << qdict.getKey("/NewDict").getIntValue() << std::endl;
    // Swap dict and array
    pdf.swapObjects(qdict.getObjGen(), qarray.getObjGen());
    // Now qarray will resolve to new object and qdict resolves to
    // the array
    std::cout << "swapped array: " << qdict.getArrayItem(0).getName() << std::endl;
    std::cout << "new dict: " << qarray.getKey("/NewDict").getIntValue() << std::endl;
    // Reread qdict, still pointing to an array
    qdict = pdf.getObjectByObjGen(qdict.getObjGen());
    std::cout << "swapped array: " << qdict.getArrayItem(0).getName() << std::endl;

    // Exercise getAsMap and getAsArray
    std::vector<QPDFObjectHandle> array_elements = qdict.getArrayAsVector();
    std::map<std::string, QPDFObjectHandle> dict_items = qarray.getDictAsMap();
    if ((array_elements.size() == 1) && (array_elements.at(0).getName() == "/Array") &&
        (dict_items.size() == 1) && (dict_items["/NewDict"].getIntValue() == 2)) {
        std::cout << "array and dictionary contents are correct" << std::endl;
    }

    // Exercise writing to memory buffer
    for (int i = 0; i < 2; ++i) {
        QPDFWriter w(pdf);
        w.setOutputMemory();
        // Exercise setOutputMemory with and without static ID
        w.setStaticID(i == 0);
        w.setStreamDataMode(qpdf_s_preserve);
        w.write();
        Buffer* b = w.getBuffer();
        std::string const filename = (i == 0 ? "a.pdf" : "b.pdf");
        FILE* f = QUtil::safe_fopen(filename.c_str(), "wb");
        fwrite(b->getBuffer(), b->getSize(), 1, f);
        fclose(f);
        delete b;
    }
}